

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O3

void __thiscall
argstest::HelpFlag::ParseValue
          (HelpFlag *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *param_1)

{
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  (this->super_Flag).super_FlagBase.super_NamedBase.super_Base.error = Help;
  (*(this->super_Flag).super_FlagBase.super_NamedBase.super_Base._vptr_Base[0x14])
            ((string *)local_30,this);
  std::__cxx11::string::operator=
            ((string *)&(this->super_Flag).super_FlagBase.super_NamedBase.super_Base.errorMsg,
             (string *)local_30);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0]);
  }
  return;
}

Assistant:

virtual void ParseValue(const std::vector<std::string> &)
            {
#ifdef ARGS_NOEXCEPT
                    error = Error::Help;
                    errorMsg = Name();
#else
                    throw Help(Name());
#endif
            }